

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convert.h
# Opt level: O1

t_define<xemmai::t_os> * __thiscall
xemmai::t_define<xemmai::t_os>::operator()
          (t_define<xemmai::t_os> *this,t_object *a_name,t_function a_function)

{
  long *plVar1;
  t_object *local_40;
  t_object *local_38;
  t_function local_30;
  t_object *local_28;
  
  local_30 = a_function;
  local_28 = a_name;
  plVar1 = (long *)__tls_get_addr(&PTR_0011ee38);
  local_40 = (t_object *)&this->v_library[-1].v_type_file_type.v_slot;
  local_38 = t_type_of<xemmai::t_object>::
             f_new<xemmai::t_native,void(*&)(xemmai::t_library*,xemmai::t_value<xemmai::t_pointer>*,unsigned_long),xemmai::t_object*>
                       (*(t_type_of<xemmai::t_object> **)(*plVar1 + 0xa8),
                        (_func_void_t_library_ptr_t_value<xemmai::t_pointer>_ptr_unsigned_long **)
                        &local_30,&local_40);
  std::
  vector<std::pair<xemmai::t_root,xemmai::t_value<xemmai::t_root>>,std::allocator<std::pair<xemmai::t_root,xemmai::t_value<xemmai::t_root>>>>
  ::emplace_back<xemmai::t_object*&,xemmai::t_object*>
            ((vector<std::pair<xemmai::t_root,xemmai::t_value<xemmai::t_root>>,std::allocator<std::pair<xemmai::t_root,xemmai::t_value<xemmai::t_root>>>>
              *)&(this->v_fields).v_class,&local_28,&local_38);
  return this;
}

Assistant:

t_define& operator()(t_object* a_name, t_library::t_function a_function)
	{
		v_fields.v_class.emplace_back(a_name, f_new<t_native>(f_global(), a_function, t_object::f_of(v_library)));
		return *this;
	}